

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O2

ostream * wasm::printExpression
                    (Expression *expression,ostream *o,bool minify,bool full,Module *wasm)

{
  bool bVar1;
  undefined7 in_register_00000011;
  undefined1 local_1b0 [8];
  PrintSExpression print;
  
  if (expression == (Expression *)0x0) {
    std::operator<<(o,"(null expression)");
  }
  else {
    PrintSExpression::PrintSExpression((PrintSExpression *)local_1b0,o);
    print.o._4_1_ = 0;
    print._8_8_ = (long)
                  "\n  var scratchBuffer = new ArrayBuffer(16);\n  var i32ScratchView = new Int32Array(scratchBuffer);\n  var f32ScratchView = new Float32Array(scratchBuffer);\n  var f64ScratchView = new Float64Array(scratchBuffer);\n  "
                  + 0xd3;
    print.maybeSpace = "\n";
    print.moduleStackIR.super__Optional_base<wasm::ModuleStackIR,_false,_false>._M_payload.
    super__Optional_payload<wasm::ModuleStackIR,_true,_false,_false>.
    super__Optional_payload_base<wasm::ModuleStackIR>._56_8_ =
         (Module *)CONCAT71(in_register_00000011,minify);
    bVar1 = anon_unknown_0::isFullForced();
    if (bVar1) {
      print.maybeNewLine._0_1_ = 1;
    }
    PrintSExpression::visit((PrintSExpression *)local_1b0,expression);
    bVar1 = anon_unknown_0::isFullForced();
    if (bVar1) {
      std::operator<<(o," (; ");
      anon_unknown_0::printTypeOrName
                ((Type)(expression->type).id,o,(Module *)CONCAT71(in_register_00000011,minify));
      std::operator<<(o," ;)");
    }
    PrintSExpression::~PrintSExpression((PrintSExpression *)local_1b0);
  }
  return o;
}

Assistant:

static std::ostream& printExpression(Expression* expression,
                                     std::ostream& o,
                                     bool minify,
                                     bool full,
                                     Module* wasm) {
  if (!expression) {
    o << "(null expression)";
    return o;
  }
  PrintSExpression print(o);
  print.setMinify(minify);
  print.currModule = wasm;
  if (full || isFullForced()) {
    print.setFull(true);
  }
  print.visit(expression);
  if (full || isFullForced()) {
    o << " (; ";
    printTypeOrName(expression->type, o, wasm);
    o << " ;)";
  }
  return o;
}